

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

MOJOSHADER_irExpression *
build_ir_compare(Context_conflict *ctx,MOJOSHADER_irConditionType operation,
                MOJOSHADER_irExpression *left,MOJOSHADER_irExpression *right,
                MOJOSHADER_irExpression *tval,MOJOSHADER_irExpression *fval)

{
  int iftrue;
  int index;
  MOJOSHADER_astDataTypeType type;
  int elements;
  MOJOSHADER_irStatement *pMVar1;
  MOJOSHADER_irStatement *pMVar2;
  MOJOSHADER_irExpression *pMVar3;
  MOJOSHADER_irStatement *pMVar4;
  MOJOSHADER_irStatement *pMVar5;
  MOJOSHADER_irStatement *pMVar6;
  MOJOSHADER_irStatement *pMVar7;
  MOJOSHADER_irStatement *next;
  int iVar8;
  
  iftrue = ctx->ir_label_count;
  index = ctx->ir_temp_count;
  ctx->ir_label_count = iftrue + 3;
  ctx->ir_temp_count = index + 1;
  if (((tval != (MOJOSHADER_irExpression *)0x0) && (fval != (MOJOSHADER_irExpression *)0x0)) &&
     (type = (tval->info).type, type == (fval->info).type)) {
    elements = (tval->info).elements;
    if (elements == (fval->info).elements) {
      pMVar1 = new_ir_cjump(ctx,operation,left,right,iftrue,iftrue + 1);
      pMVar2 = new_ir_label(ctx,iftrue);
      iVar8 = elements;
      pMVar3 = new_ir_temp(ctx,index,type,elements);
      pMVar4 = new_ir_move(ctx,pMVar3,tval,iVar8);
      pMVar5 = new_ir_jump(ctx,iftrue + 2);
      pMVar6 = new_ir_label(ctx,iftrue + 1);
      iVar8 = elements;
      pMVar3 = new_ir_temp(ctx,index,type,elements);
      pMVar7 = new_ir_move(ctx,pMVar3,fval,iVar8);
      next = new_ir_label(ctx,iftrue + 2);
      pMVar7 = new_ir_seq(ctx,pMVar7,next);
      pMVar6 = new_ir_seq(ctx,pMVar6,pMVar7);
      pMVar5 = new_ir_seq(ctx,pMVar5,pMVar6);
      pMVar4 = new_ir_seq(ctx,pMVar4,pMVar5);
      pMVar2 = new_ir_seq(ctx,pMVar2,pMVar4);
      pMVar1 = new_ir_seq(ctx,pMVar1,pMVar2);
      pMVar3 = new_ir_temp(ctx,index,type,elements);
      pMVar3 = new_ir_eseq(ctx,pMVar1,pMVar3);
      return pMVar3;
    }
    __assert_fail("tval && fval && (tval->info.elements == fval->info.elements)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x12ea,
                  "MOJOSHADER_irExpression *build_ir_compare(Context *, const MOJOSHADER_irConditionType, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *)"
                 );
  }
  __assert_fail("tval && fval && (tval->info.type == fval->info.type)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0x12e9,
                "MOJOSHADER_irExpression *build_ir_compare(Context *, const MOJOSHADER_irConditionType, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *, MOJOSHADER_irExpression *)"
               );
}

Assistant:

static MOJOSHADER_irExpression *build_ir_compare(Context *ctx,
                                    const MOJOSHADER_irConditionType operation,
                                    MOJOSHADER_irExpression *left,
                                    MOJOSHADER_irExpression *right,
                                    MOJOSHADER_irExpression *tval,
                                    MOJOSHADER_irExpression *fval)
{
    /* The gist...
            cjump x < y, t, f  // '<' is whatever operation
        t:
            move tmp, tval
            jump join
        f:
            move tmp, fval
        join:
    */

    const int t = generate_ir_label(ctx);
    const int f = generate_ir_label(ctx);
    const int join = generate_ir_label(ctx);
    const int tmp = generate_ir_temp(ctx);

    assert(tval && fval && (tval->info.type == fval->info.type));
    assert(tval && fval && (tval->info.elements == fval->info.elements));

    const MOJOSHADER_astDataTypeType dt = tval->info.type;
    const int elements = tval->info.elements;

    return new_ir_eseq(ctx,
                new_ir_seq(ctx, new_ir_cjump(ctx, operation, left, right, t, f),
                new_ir_seq(ctx, new_ir_label(ctx, t),
                new_ir_seq(ctx, new_ir_move(ctx, new_ir_temp(ctx, tmp, dt, elements), tval, -1),
                new_ir_seq(ctx, new_ir_jump(ctx, join),
                new_ir_seq(ctx, new_ir_label(ctx, f),
                new_ir_seq(ctx, new_ir_move(ctx, new_ir_temp(ctx, tmp, dt, elements), fval, -1),
                                new_ir_label(ctx, join))))))),
                    new_ir_temp(ctx, tmp, dt, elements));
}